

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.c
# Opt level: O3

size_t ZSTD_compressBlock_doubleFast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  int *piVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  BYTE *pBVar8;
  U32 *pUVar9;
  U32 *pUVar10;
  bool bVar11;
  uint uVar12;
  U32 UVar13;
  uint uVar14;
  BYTE *op;
  long *plVar15;
  ulong *puVar16;
  long lVar17;
  long *plVar18;
  long *plVar19;
  long *plVar20;
  byte bVar21;
  byte bVar22;
  ulong *puVar23;
  ulong *puVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  BYTE *pStart_3;
  BYTE *pBVar30;
  ulong uVar31;
  ulong *puVar32;
  seqDef *psVar33;
  BYTE *pBVar34;
  ulong uVar35;
  BYTE *ip;
  BYTE *pInLoopLimit;
  int iVar36;
  uint uVar37;
  long lVar38;
  ulong uVar39;
  U32 *hashSmall;
  long *local_d8;
  BYTE *iend;
  U32 *hashLong;
  BYTE *ilimit;
  BYTE *base;
  BYTE *prefixLowest;
  U32 prefixLowestIndex;
  
  pBVar8 = (ms->window).base;
  uVar14 = (ms->window).dictLimit;
  pBVar30 = pBVar8 + uVar14;
  puVar3 = (ulong *)((long)src + srcSize);
  plVar15 = (long *)((long)src + (srcSize - 8));
  uVar5 = *rep;
  uVar6 = rep[1];
  local_d8 = (long *)((ulong)((int)src == (int)pBVar30) + (long)src);
  uVar12 = (int)local_d8 - (int)pBVar30;
  uVar39 = (ulong)uVar6;
  if (uVar12 < uVar6) {
    uVar39 = 0;
  }
  uVar37 = (uint)uVar39;
  uVar27 = 0;
  if (uVar5 <= uVar12) {
    uVar27 = uVar5;
  }
  uVar7 = (ms->cParams).minMatch;
  pUVar9 = ms->hashTable;
  pUVar10 = ms->chainTable;
  iVar36 = (int)pBVar8;
  if (uVar7 == 5) {
    if (local_d8 < plVar15) {
      bVar22 = 0x40 - (char)(ms->cParams).hashLog;
      bVar21 = 0x40 - (char)(ms->cParams).chainLog;
      puVar1 = (ulong *)((long)puVar3 - 7);
      puVar2 = (ulong *)((long)puVar3 - 3);
      puVar16 = (ulong *)((long)puVar3 - 1);
      do {
        lVar38 = *local_d8;
        uVar26 = (ulong)(lVar38 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f);
        uVar28 = (ulong)(lVar38 * -0x30e4432345000000) >> (bVar21 & 0x3f);
        uVar29 = (long)local_d8 - (long)pBVar8;
        uVar37 = pUVar9[uVar26];
        uVar31 = (ulong)uVar37;
        uVar7 = pUVar10[uVar28];
        uVar35 = (ulong)uVar7;
        UVar13 = (U32)uVar29;
        pUVar10[uVar28] = UVar13;
        pUVar9[uVar26] = UVar13;
        plVar20 = (long *)((long)local_d8 + 1);
        if ((uVar27 == 0) ||
           (*(int *)((long)plVar20 - (ulong)uVar27) != *(int *)((long)local_d8 + 1))) {
          if ((uVar14 < uVar37) && (plVar19 = (long *)(pBVar8 + uVar31), *plVar19 == lVar38)) {
            puVar24 = (ulong *)(local_d8 + 1);
            puVar23 = (ulong *)(plVar19 + 1);
            puVar32 = puVar24;
            if (puVar24 < puVar1) {
              if (*puVar23 == *puVar24) {
                lVar38 = 0;
                do {
                  puVar23 = (ulong *)((long)local_d8 + lVar38 + 0x10);
                  if (puVar1 <= puVar23) {
                    puVar23 = (ulong *)(pBVar8 + lVar38 + uVar31 + 0x10);
                    puVar32 = (ulong *)((long)local_d8 + lVar38 + 0x10);
                    goto LAB_004255b3;
                  }
                  lVar17 = lVar38 + uVar31 + 0x10;
                  uVar39 = *puVar23;
                  lVar38 = lVar38 + 8;
                } while (*(ulong *)(pBVar8 + lVar17) == uVar39);
                uVar39 = uVar39 ^ *(ulong *)(pBVar8 + lVar17);
                uVar26 = 0;
                if (uVar39 != 0) {
                  for (; (uVar39 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                  }
                }
                uVar39 = (uVar26 >> 3 & 0x1fffffff) + lVar38;
              }
              else {
                uVar26 = *puVar24 ^ *puVar23;
                uVar39 = 0;
                if (uVar26 != 0) {
                  for (; (uVar26 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                  }
                }
                uVar39 = uVar39 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_004255b3:
              if ((puVar32 < puVar2) && ((int)*puVar23 == (int)*puVar32)) {
                puVar32 = (ulong *)((long)puVar32 + 4);
                puVar23 = (ulong *)((long)puVar23 + 4);
              }
              if ((puVar32 < puVar16) && ((short)*puVar23 == (short)*puVar32)) {
                puVar32 = (ulong *)((long)puVar32 + 2);
                puVar23 = (ulong *)((long)puVar23 + 2);
              }
              if (puVar32 < puVar3) {
                puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar23 == (char)*puVar32));
              }
              uVar39 = (long)puVar32 - (long)puVar24;
            }
            lVar38 = uVar39 + 8;
            uVar37 = (int)local_d8 - (int)plVar19;
            plVar20 = local_d8;
            if (src < local_d8) {
              pBVar34 = pBVar8 + (uVar31 - 1);
              plVar20 = (long *)((long)local_d8 + -1);
              while (plVar19 = plVar20, (BYTE)*plVar20 == *pBVar34) {
                lVar38 = lVar38 + 1;
                plVar19 = (long *)((long)plVar20 + -1);
                if ((pBVar34 <= pBVar30) ||
                   (pBVar34 = pBVar34 + -1, bVar11 = plVar20 <= src, plVar20 = plVar19, bVar11))
                break;
              }
              goto LAB_0042577b;
            }
            goto LAB_0042577e;
          }
          if ((uVar14 < uVar7) && (piVar4 = (int *)(pBVar8 + uVar35), *piVar4 == (int)*local_d8)) {
            lVar38 = *plVar20;
            uVar26 = (ulong)(lVar38 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f);
            uVar37 = pUVar9[uVar26];
            uVar39 = (ulong)uVar37;
            pUVar9[uVar26] = UVar13 + 1;
            if ((uVar14 < uVar37) && (plVar19 = (long *)(pBVar8 + uVar39), *plVar19 == lVar38)) {
              puVar24 = (ulong *)((long)local_d8 + 9);
              puVar23 = (ulong *)(plVar19 + 1);
              puVar32 = puVar24;
              if (puVar24 < puVar1) {
                if (*puVar23 == *puVar24) {
                  lVar38 = 0;
                  do {
                    puVar23 = (ulong *)((long)local_d8 + lVar38 + 0x11);
                    if (puVar1 <= puVar23) {
                      puVar23 = (ulong *)(pBVar8 + lVar38 + uVar39 + 0x10);
                      puVar32 = (ulong *)((long)local_d8 + lVar38 + 0x11);
                      goto LAB_004256fe;
                    }
                    lVar17 = lVar38 + uVar39 + 0x10;
                    uVar26 = *puVar23;
                    lVar38 = lVar38 + 8;
                  } while (*(ulong *)(pBVar8 + lVar17) == uVar26);
                  uVar26 = uVar26 ^ *(ulong *)(pBVar8 + lVar17);
                  uVar28 = 0;
                  if (uVar26 != 0) {
                    for (; (uVar26 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                    }
                  }
                  uVar26 = (uVar28 >> 3 & 0x1fffffff) + lVar38;
                }
                else {
                  uVar28 = *puVar24 ^ *puVar23;
                  uVar26 = 0;
                  if (uVar28 != 0) {
                    for (; (uVar28 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                    }
                  }
                  uVar26 = uVar26 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_004256fe:
                if ((puVar32 < puVar2) && ((int)*puVar23 == (int)*puVar32)) {
                  puVar32 = (ulong *)((long)puVar32 + 4);
                  puVar23 = (ulong *)((long)puVar23 + 4);
                }
                if ((puVar32 < puVar16) && ((short)*puVar23 == (short)*puVar32)) {
                  puVar32 = (ulong *)((long)puVar32 + 2);
                  puVar23 = (ulong *)((long)puVar23 + 2);
                }
                if (puVar32 < puVar3) {
                  puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar23 == (char)*puVar32));
                }
                uVar26 = (long)puVar32 - (long)puVar24;
              }
              lVar38 = uVar26 + 8;
              uVar37 = (int)plVar20 - (int)plVar19;
              if (src < plVar20) {
                pBVar34 = pBVar8 + (uVar39 - 1);
                while (plVar19 = local_d8, (BYTE)*local_d8 == *pBVar34) {
                  lVar38 = lVar38 + 1;
                  plVar19 = (long *)((long)local_d8 + -1);
                  if ((pBVar34 <= pBVar30) ||
                     (pBVar34 = pBVar34 + -1, bVar11 = local_d8 <= src, local_d8 = plVar19, bVar11))
                  break;
                }
LAB_0042577b:
                plVar20 = (long *)((long)plVar19 + 1);
              }
            }
            else {
              puVar24 = (ulong *)((long)local_d8 + 4);
              puVar23 = (ulong *)(piVar4 + 1);
              puVar32 = puVar24;
              if (puVar24 < puVar1) {
                if (*puVar23 == *puVar24) {
                  lVar38 = 0;
                  do {
                    puVar23 = (ulong *)((long)local_d8 + lVar38 + 0xc);
                    if (puVar1 <= puVar23) {
                      puVar23 = (ulong *)(pBVar8 + lVar38 + uVar35 + 0xc);
                      puVar32 = (ulong *)((long)local_d8 + lVar38 + 0xc);
                      goto LAB_00425653;
                    }
                    lVar17 = lVar38 + uVar35 + 0xc;
                    uVar39 = *puVar23;
                    lVar38 = lVar38 + 8;
                  } while (*(ulong *)(pBVar8 + lVar17) == uVar39);
                  uVar39 = uVar39 ^ *(ulong *)(pBVar8 + lVar17);
                  uVar26 = 0;
                  if (uVar39 != 0) {
                    for (; (uVar39 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                    }
                  }
                  uVar39 = (uVar26 >> 3 & 0x1fffffff) + lVar38;
                }
                else {
                  uVar26 = *puVar24 ^ *puVar23;
                  uVar39 = 0;
                  if (uVar26 != 0) {
                    for (; (uVar26 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                    }
                  }
                  uVar39 = uVar39 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_00425653:
                if ((puVar32 < puVar2) && ((int)*puVar23 == (int)*puVar32)) {
                  puVar32 = (ulong *)((long)puVar32 + 4);
                  puVar23 = (ulong *)((long)puVar23 + 4);
                }
                if ((puVar32 < puVar16) && ((short)*puVar23 == (short)*puVar32)) {
                  puVar32 = (ulong *)((long)puVar32 + 2);
                  puVar23 = (ulong *)((long)puVar23 + 2);
                }
                if (puVar32 < puVar3) {
                  puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar23 == (char)*puVar32));
                }
                uVar39 = (long)puVar32 - (long)puVar24;
              }
              lVar38 = uVar39 + 4;
              uVar37 = (int)local_d8 - (int)piVar4;
              plVar20 = local_d8;
              if (src < local_d8) {
                pBVar34 = pBVar8 + (uVar35 - 1);
                plVar20 = (long *)((long)local_d8 + -1);
                while (plVar19 = plVar20, (BYTE)*plVar20 == *pBVar34) {
                  lVar38 = lVar38 + 1;
                  plVar19 = (long *)((long)plVar20 + -1);
                  if ((pBVar34 <= pBVar30) ||
                     (pBVar34 = pBVar34 + -1, bVar11 = plVar20 <= src, plVar20 = plVar19, bVar11))
                  break;
                }
                goto LAB_0042577b;
              }
            }
LAB_0042577e:
            uVar39 = (long)plVar20 - (long)src;
            plVar18 = (long *)seqStore->lit;
            plVar19 = (long *)((long)plVar18 + uVar39);
            do {
              *plVar18 = *src;
              plVar18 = plVar18 + 1;
              src = (void *)((long)src + 8);
            } while (plVar18 < plVar19);
            seqStore->lit = seqStore->lit + uVar39;
            if (uVar39 < 0x10000) {
              psVar33 = seqStore->sequences;
            }
            else {
              seqStore->longLengthID = 1;
              psVar33 = seqStore->sequences;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar33 - (long)seqStore->sequencesStart) >> 3);
            }
            uVar26 = lVar38 - 3;
            psVar33->litLength = (U16)uVar39;
            psVar33->offset = uVar37 + 3;
            uVar39 = (ulong)uVar27;
            uVar27 = uVar37;
            goto joined_r0x004252e0;
          }
          local_d8 = (long *)((long)local_d8 + ((long)local_d8 - (long)src >> 8) + 1);
        }
        else {
          lVar38 = -(ulong)uVar27;
          puVar24 = (ulong *)((long)local_d8 + 5);
          puVar32 = (ulong *)((long)local_d8 + lVar38 + 5);
          puVar23 = puVar24;
          if (puVar24 < puVar1) {
            if (*puVar32 == *puVar24) {
              lVar17 = 0;
              do {
                puVar23 = (ulong *)((long)local_d8 + lVar17 + 0xd);
                if (puVar1 <= puVar23) {
                  puVar32 = (ulong *)((long)local_d8 + lVar38 + lVar17 + 0xd);
                  puVar23 = (ulong *)((long)local_d8 + lVar17 + 0xd);
                  goto LAB_0042522a;
                }
                uVar26 = *(ulong *)((long)local_d8 + lVar17 + lVar38 + 0xd);
                uVar28 = *puVar23;
                lVar17 = lVar17 + 8;
              } while (uVar26 == uVar28);
              uVar28 = uVar28 ^ uVar26;
              uVar26 = 0;
              if (uVar28 != 0) {
                for (; (uVar28 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                }
              }
              uVar26 = (uVar26 >> 3 & 0x1fffffff) + lVar17;
            }
            else {
              uVar28 = *puVar24 ^ *puVar32;
              uVar26 = 0;
              if (uVar28 != 0) {
                for (; (uVar28 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                }
              }
              uVar26 = uVar26 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_0042522a:
            if ((puVar23 < puVar2) && ((int)*puVar32 == (int)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 4);
              puVar32 = (ulong *)((long)puVar32 + 4);
            }
            if ((puVar23 < puVar16) && ((short)*puVar32 == (short)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 2);
              puVar32 = (ulong *)((long)puVar32 + 2);
            }
            if (puVar23 < puVar3) {
              puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar32 == (char)*puVar23));
            }
            uVar26 = (long)puVar23 - (long)puVar24;
          }
          uVar28 = (long)plVar20 - (long)src;
          plVar18 = (long *)seqStore->lit;
          plVar19 = (long *)((long)plVar18 + uVar28);
          do {
            *plVar18 = *src;
            plVar18 = plVar18 + 1;
            src = (void *)((long)src + 8);
          } while (plVar18 < plVar19);
          seqStore->lit = seqStore->lit + uVar28;
          if (uVar28 < 0x10000) {
            psVar33 = seqStore->sequences;
          }
          else {
            seqStore->longLengthID = 1;
            psVar33 = seqStore->sequences;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar33 - (long)seqStore->sequencesStart) >> 3);
          }
          lVar38 = uVar26 + 4;
          uVar26 = uVar26 + 1;
          psVar33->litLength = (U16)uVar28;
          psVar33->offset = 1;
joined_r0x004252e0:
          if (0xffff < uVar26) {
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar33 - (long)seqStore->sequencesStart) >> 3);
          }
          src = (void *)(lVar38 + (long)plVar20);
          psVar33->matchLength = (U16)uVar26;
          seqStore->sequences = psVar33 + 1;
          local_d8 = (long *)src;
          if (src <= plVar15) {
            lVar38 = *(long *)(pBVar8 + (uVar29 & 0xffffffff) + 2);
            pUVar10[(ulong)(lVar38 * -0x30e4432345000000) >> (bVar21 & 0x3f)] = UVar13 + 2;
            pUVar9[(ulong)(lVar38 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] = UVar13 + 2;
            UVar13 = ((int)src + -2) - iVar36;
            lVar38 = *(long *)((long)src + -2);
            pUVar10[(ulong)(lVar38 * -0x30e4432345000000) >> (bVar21 & 0x3f)] = UVar13;
            pUVar9[(ulong)(lVar38 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] = UVar13;
            uVar26 = (ulong)uVar27;
            do {
              uVar28 = uVar26;
              uVar26 = uVar39;
              uVar39 = uVar26;
              uVar27 = (uint)uVar28;
              local_d8 = (long *)src;
              if (((uint)uVar26 == 0) || ((int)*src != *(int *)((long)src - uVar26))) break;
              lVar38 = -uVar26;
              puVar24 = (ulong *)((long)src + 4);
              puVar32 = (ulong *)((long)src + lVar38 + 4);
              puVar23 = puVar24;
              if (puVar24 < puVar1) {
                if (*puVar32 == *puVar24) {
                  lVar17 = 0;
                  do {
                    puVar23 = (ulong *)((long)src + lVar17 + 0xc);
                    if (puVar1 <= puVar23) {
                      puVar32 = (ulong *)((long)src + lVar38 + lVar17 + 0xc);
                      puVar23 = (ulong *)((long)src + lVar17 + 0xc);
                      goto LAB_0042546d;
                    }
                    uVar39 = *(ulong *)((long)src + lVar17 + lVar38 + 0xc);
                    uVar29 = *puVar23;
                    lVar17 = lVar17 + 8;
                  } while (uVar39 == uVar29);
                  uVar29 = uVar29 ^ uVar39;
                  uVar39 = 0;
                  if (uVar29 != 0) {
                    for (; (uVar29 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                    }
                  }
                  uVar39 = (uVar39 >> 3 & 0x1fffffff) + lVar17;
                }
                else {
                  uVar29 = *puVar24 ^ *puVar32;
                  uVar39 = 0;
                  if (uVar29 != 0) {
                    for (; (uVar29 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                    }
                  }
                  uVar39 = uVar39 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_0042546d:
                if ((puVar23 < puVar2) && ((int)*puVar32 == (int)*puVar23)) {
                  puVar23 = (ulong *)((long)puVar23 + 4);
                  puVar32 = (ulong *)((long)puVar32 + 4);
                }
                if ((puVar23 < puVar16) && ((short)*puVar32 == (short)*puVar23)) {
                  puVar23 = (ulong *)((long)puVar23 + 2);
                  puVar32 = (ulong *)((long)puVar32 + 2);
                }
                if (puVar23 < puVar3) {
                  puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar32 == (char)*puVar23));
                }
                uVar39 = (long)puVar23 - (long)puVar24;
              }
              lVar38 = *src;
              UVar13 = (int)src - iVar36;
              pUVar10[(ulong)(lVar38 * -0x30e4432345000000) >> (bVar21 & 0x3f)] = UVar13;
              pUVar9[(ulong)(lVar38 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] = UVar13;
              *(long *)seqStore->lit = *src;
              psVar33 = seqStore->sequences;
              psVar33->litLength = 0;
              psVar33->offset = 1;
              if (0xffff < uVar39 + 1) {
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar33 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar33->matchLength = (U16)(uVar39 + 1);
              seqStore->sequences = psVar33 + 1;
              src = (void *)((long)src + uVar39 + 4);
              uVar39 = uVar28;
              uVar27 = (uint)uVar26;
              local_d8 = (long *)src;
            } while (src <= plVar15);
          }
        }
        uVar37 = (uint)uVar39;
      } while (local_d8 < plVar15);
    }
  }
  else if (uVar7 == 6) {
    if (local_d8 < plVar15) {
      bVar22 = 0x40 - (char)(ms->cParams).hashLog;
      bVar21 = 0x40 - (char)(ms->cParams).chainLog;
      puVar1 = (ulong *)((long)puVar3 - 7);
      puVar2 = (ulong *)((long)puVar3 - 3);
      puVar16 = (ulong *)((long)puVar3 - 1);
      do {
        lVar38 = *local_d8;
        uVar28 = (ulong)(lVar38 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f);
        uVar26 = (ulong)(lVar38 * -0x30e4432340650000) >> (bVar21 & 0x3f);
        uVar29 = (long)local_d8 - (long)pBVar8;
        uVar37 = pUVar9[uVar28];
        uVar31 = (ulong)uVar37;
        uVar7 = pUVar10[uVar26];
        uVar35 = (ulong)uVar7;
        UVar13 = (U32)uVar29;
        pUVar10[uVar26] = UVar13;
        pUVar9[uVar28] = UVar13;
        plVar20 = (long *)((long)local_d8 + 1);
        if ((uVar27 == 0) ||
           (*(int *)((long)plVar20 - (ulong)uVar27) != *(int *)((long)local_d8 + 1))) {
          if ((uVar14 < uVar37) && (plVar19 = (long *)(pBVar8 + uVar31), *plVar19 == lVar38)) {
            puVar24 = (ulong *)(local_d8 + 1);
            puVar23 = (ulong *)(plVar19 + 1);
            puVar32 = puVar24;
            if (puVar24 < puVar1) {
              if (*puVar23 == *puVar24) {
                lVar38 = 0;
                do {
                  puVar23 = (ulong *)((long)local_d8 + lVar38 + 0x10);
                  if (puVar1 <= puVar23) {
                    puVar23 = (ulong *)(pBVar8 + lVar38 + uVar31 + 0x10);
                    puVar32 = (ulong *)((long)local_d8 + lVar38 + 0x10);
                    goto LAB_00424c5a;
                  }
                  lVar17 = lVar38 + uVar31 + 0x10;
                  uVar39 = *puVar23;
                  lVar38 = lVar38 + 8;
                } while (*(ulong *)(pBVar8 + lVar17) == uVar39);
                uVar39 = uVar39 ^ *(ulong *)(pBVar8 + lVar17);
                uVar26 = 0;
                if (uVar39 != 0) {
                  for (; (uVar39 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                  }
                }
                uVar39 = (uVar26 >> 3 & 0x1fffffff) + lVar38;
              }
              else {
                uVar26 = *puVar24 ^ *puVar23;
                uVar39 = 0;
                if (uVar26 != 0) {
                  for (; (uVar26 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                  }
                }
                uVar39 = uVar39 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_00424c5a:
              if ((puVar32 < puVar2) && ((int)*puVar23 == (int)*puVar32)) {
                puVar32 = (ulong *)((long)puVar32 + 4);
                puVar23 = (ulong *)((long)puVar23 + 4);
              }
              if ((puVar32 < puVar16) && ((short)*puVar23 == (short)*puVar32)) {
                puVar32 = (ulong *)((long)puVar32 + 2);
                puVar23 = (ulong *)((long)puVar23 + 2);
              }
              if (puVar32 < puVar3) {
                puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar23 == (char)*puVar32));
              }
              uVar39 = (long)puVar32 - (long)puVar24;
            }
            lVar38 = uVar39 + 8;
            uVar37 = (int)local_d8 - (int)plVar19;
            plVar20 = local_d8;
            if (src < local_d8) {
              pBVar34 = pBVar8 + (uVar31 - 1);
              local_d8 = (long *)((long)local_d8 + -1);
              while (plVar20 = local_d8, (BYTE)*local_d8 == *pBVar34) {
                lVar38 = lVar38 + 1;
                plVar20 = (long *)((long)local_d8 + -1);
                if ((pBVar34 <= pBVar30) ||
                   (pBVar34 = pBVar34 + -1, bVar11 = local_d8 <= src, local_d8 = plVar20, bVar11))
                break;
              }
              goto LAB_00424e60;
            }
            goto LAB_00424e63;
          }
          if ((uVar14 < uVar7) && (piVar4 = (int *)(pBVar8 + uVar35), *piVar4 == (int)*local_d8)) {
            lVar38 = *plVar20;
            uVar26 = (ulong)(lVar38 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f);
            uVar37 = pUVar9[uVar26];
            uVar39 = (ulong)uVar37;
            pUVar9[uVar26] = UVar13 + 1;
            if ((uVar14 < uVar37) && (plVar19 = (long *)(pBVar8 + uVar39), *plVar19 == lVar38)) {
              puVar24 = (ulong *)((long)local_d8 + 9);
              puVar23 = (ulong *)(plVar19 + 1);
              puVar32 = puVar24;
              if (puVar24 < puVar1) {
                if (*puVar23 == *puVar24) {
                  lVar38 = 0;
                  do {
                    puVar23 = (ulong *)((long)local_d8 + lVar38 + 0x11);
                    if (puVar1 <= puVar23) {
                      puVar23 = (ulong *)(pBVar8 + lVar38 + uVar39 + 0x10);
                      puVar32 = (ulong *)((long)local_d8 + lVar38 + 0x11);
                      goto LAB_00424dd3;
                    }
                    lVar17 = lVar38 + uVar39 + 0x10;
                    uVar26 = *puVar23;
                    lVar38 = lVar38 + 8;
                  } while (*(ulong *)(pBVar8 + lVar17) == uVar26);
                  uVar26 = uVar26 ^ *(ulong *)(pBVar8 + lVar17);
                  uVar28 = 0;
                  if (uVar26 != 0) {
                    for (; (uVar26 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                    }
                  }
                  uVar26 = (uVar28 >> 3 & 0x1fffffff) + lVar38;
                }
                else {
                  uVar28 = *puVar24 ^ *puVar23;
                  uVar26 = 0;
                  if (uVar28 != 0) {
                    for (; (uVar28 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                    }
                  }
                  uVar26 = uVar26 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_00424dd3:
                if ((puVar32 < puVar2) && ((int)*puVar23 == (int)*puVar32)) {
                  puVar32 = (ulong *)((long)puVar32 + 4);
                  puVar23 = (ulong *)((long)puVar23 + 4);
                }
                if ((puVar32 < puVar16) && ((short)*puVar23 == (short)*puVar32)) {
                  puVar32 = (ulong *)((long)puVar32 + 2);
                  puVar23 = (ulong *)((long)puVar23 + 2);
                }
                if (puVar32 < puVar3) {
                  puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar23 == (char)*puVar32));
                }
                uVar26 = (long)puVar32 - (long)puVar24;
              }
              lVar38 = uVar26 + 8;
              uVar37 = (int)plVar20 - (int)plVar19;
              if (src < plVar20) {
                pBVar34 = pBVar8 + (uVar39 - 1);
                while (plVar20 = local_d8, (BYTE)*local_d8 == *pBVar34) {
                  lVar38 = lVar38 + 1;
                  plVar20 = (long *)((long)local_d8 + -1);
                  if ((pBVar34 <= pBVar30) ||
                     (pBVar34 = pBVar34 + -1, bVar11 = local_d8 <= src, local_d8 = plVar20, bVar11))
                  break;
                }
LAB_00424e60:
                plVar20 = (long *)((long)plVar20 + 1);
              }
            }
            else {
              puVar24 = (ulong *)((long)local_d8 + 4);
              puVar23 = (ulong *)(piVar4 + 1);
              puVar32 = puVar24;
              if (puVar24 < puVar1) {
                if (*puVar23 == *puVar24) {
                  lVar38 = 0;
                  do {
                    puVar23 = (ulong *)((long)local_d8 + lVar38 + 0xc);
                    if (puVar1 <= puVar23) {
                      puVar23 = (ulong *)(pBVar8 + lVar38 + uVar35 + 0xc);
                      puVar32 = (ulong *)((long)local_d8 + lVar38 + 0xc);
                      goto LAB_00424d0f;
                    }
                    lVar17 = lVar38 + uVar35 + 0xc;
                    uVar39 = *puVar23;
                    lVar38 = lVar38 + 8;
                  } while (*(ulong *)(pBVar8 + lVar17) == uVar39);
                  uVar39 = uVar39 ^ *(ulong *)(pBVar8 + lVar17);
                  uVar26 = 0;
                  if (uVar39 != 0) {
                    for (; (uVar39 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                    }
                  }
                  uVar39 = (uVar26 >> 3 & 0x1fffffff) + lVar38;
                }
                else {
                  uVar26 = *puVar24 ^ *puVar23;
                  uVar39 = 0;
                  if (uVar26 != 0) {
                    for (; (uVar26 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                    }
                  }
                  uVar39 = uVar39 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_00424d0f:
                if ((puVar32 < puVar2) && ((int)*puVar23 == (int)*puVar32)) {
                  puVar32 = (ulong *)((long)puVar32 + 4);
                  puVar23 = (ulong *)((long)puVar23 + 4);
                }
                if ((puVar32 < puVar16) && ((short)*puVar23 == (short)*puVar32)) {
                  puVar32 = (ulong *)((long)puVar32 + 2);
                  puVar23 = (ulong *)((long)puVar23 + 2);
                }
                if (puVar32 < puVar3) {
                  puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar23 == (char)*puVar32));
                }
                uVar39 = (long)puVar32 - (long)puVar24;
              }
              lVar38 = uVar39 + 4;
              uVar37 = (int)local_d8 - (int)piVar4;
              plVar20 = local_d8;
              if (src < local_d8) {
                pBVar34 = pBVar8 + (uVar35 - 1);
                local_d8 = (long *)((long)local_d8 + -1);
                while (plVar20 = local_d8, (BYTE)*local_d8 == *pBVar34) {
                  lVar38 = lVar38 + 1;
                  plVar20 = (long *)((long)local_d8 + -1);
                  if ((pBVar34 <= pBVar30) ||
                     (pBVar34 = pBVar34 + -1, bVar11 = local_d8 <= src, local_d8 = plVar20, bVar11))
                  break;
                }
                goto LAB_00424e60;
              }
            }
LAB_00424e63:
            uVar39 = (long)plVar20 - (long)src;
            plVar18 = (long *)seqStore->lit;
            plVar19 = (long *)((long)plVar18 + uVar39);
            do {
              *plVar18 = *src;
              plVar18 = plVar18 + 1;
              src = (void *)((long)src + 8);
            } while (plVar18 < plVar19);
            seqStore->lit = seqStore->lit + uVar39;
            if (uVar39 < 0x10000) {
              psVar33 = seqStore->sequences;
            }
            else {
              seqStore->longLengthID = 1;
              psVar33 = seqStore->sequences;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar33 - (long)seqStore->sequencesStart) >> 3);
            }
            uVar26 = lVar38 - 3;
            psVar33->litLength = (U16)uVar39;
            psVar33->offset = uVar37 + 3;
            uVar39 = (ulong)uVar27;
            uVar27 = uVar37;
            goto joined_r0x00424ecf;
          }
          local_d8 = (long *)((long)local_d8 + ((long)local_d8 - (long)src >> 8) + 1);
        }
        else {
          lVar38 = -(ulong)uVar27;
          puVar24 = (ulong *)((long)local_d8 + 5);
          puVar32 = (ulong *)((long)local_d8 + lVar38 + 5);
          puVar23 = puVar24;
          if (puVar24 < puVar1) {
            if (*puVar32 == *puVar24) {
              lVar17 = 0;
              do {
                puVar23 = (ulong *)((long)local_d8 + lVar17 + 0xd);
                if (puVar1 <= puVar23) {
                  puVar32 = (ulong *)((long)local_d8 + lVar38 + lVar17 + 0xd);
                  puVar23 = (ulong *)((long)local_d8 + lVar17 + 0xd);
                  goto LAB_004248e2;
                }
                uVar26 = *(ulong *)((long)local_d8 + lVar17 + lVar38 + 0xd);
                uVar28 = *puVar23;
                lVar17 = lVar17 + 8;
              } while (uVar26 == uVar28);
              uVar28 = uVar28 ^ uVar26;
              uVar26 = 0;
              if (uVar28 != 0) {
                for (; (uVar28 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                }
              }
              uVar26 = (uVar26 >> 3 & 0x1fffffff) + lVar17;
            }
            else {
              uVar28 = *puVar24 ^ *puVar32;
              uVar26 = 0;
              if (uVar28 != 0) {
                for (; (uVar28 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                }
              }
              uVar26 = uVar26 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_004248e2:
            if ((puVar23 < puVar2) && ((int)*puVar32 == (int)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 4);
              puVar32 = (ulong *)((long)puVar32 + 4);
            }
            if ((puVar23 < puVar16) && ((short)*puVar32 == (short)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 2);
              puVar32 = (ulong *)((long)puVar32 + 2);
            }
            if (puVar23 < puVar3) {
              puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar32 == (char)*puVar23));
            }
            uVar26 = (long)puVar23 - (long)puVar24;
          }
          uVar28 = (long)plVar20 - (long)src;
          plVar18 = (long *)seqStore->lit;
          plVar19 = (long *)((long)plVar18 + uVar28);
          do {
            *plVar18 = *src;
            plVar18 = plVar18 + 1;
            src = (void *)((long)src + 8);
          } while (plVar18 < plVar19);
          seqStore->lit = seqStore->lit + uVar28;
          if (uVar28 < 0x10000) {
            psVar33 = seqStore->sequences;
          }
          else {
            seqStore->longLengthID = 1;
            psVar33 = seqStore->sequences;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar33 - (long)seqStore->sequencesStart) >> 3);
          }
          lVar38 = uVar26 + 4;
          uVar26 = uVar26 + 1;
          psVar33->litLength = (U16)uVar28;
          psVar33->offset = 1;
joined_r0x00424ecf:
          if (0xffff < uVar26) {
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar33 - (long)seqStore->sequencesStart) >> 3);
          }
          src = (void *)(lVar38 + (long)plVar20);
          psVar33->matchLength = (U16)uVar26;
          seqStore->sequences = psVar33 + 1;
          local_d8 = (long *)src;
          if (src <= plVar15) {
            lVar38 = *(long *)(pBVar8 + (uVar29 & 0xffffffff) + 2);
            pUVar10[(ulong)(lVar38 * -0x30e4432340650000) >> (bVar21 & 0x3f)] = UVar13 + 2;
            pUVar9[(ulong)(lVar38 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] = UVar13 + 2;
            UVar13 = ((int)src + -2) - iVar36;
            lVar38 = *(long *)((long)src + -2);
            pUVar10[(ulong)(lVar38 * -0x30e4432340650000) >> (bVar21 & 0x3f)] = UVar13;
            pUVar9[(ulong)(lVar38 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] = UVar13;
            uVar26 = (ulong)uVar27;
            do {
              uVar28 = uVar26;
              uVar26 = uVar39;
              uVar39 = uVar26;
              uVar27 = (uint)uVar28;
              local_d8 = (long *)src;
              if (((uint)uVar26 == 0) || ((int)*src != *(int *)((long)src - uVar26))) break;
              lVar38 = -uVar26;
              puVar24 = (ulong *)((long)src + 4);
              puVar32 = (ulong *)((long)src + lVar38 + 4);
              puVar23 = puVar24;
              if (puVar24 < puVar1) {
                if (*puVar32 == *puVar24) {
                  lVar17 = 0;
                  do {
                    puVar23 = (ulong *)((long)src + lVar17 + 0xc);
                    if (puVar1 <= puVar23) {
                      puVar32 = (ulong *)((long)src + lVar38 + lVar17 + 0xc);
                      puVar23 = (ulong *)((long)src + lVar17 + 0xc);
                      goto LAB_00424b0e;
                    }
                    uVar39 = *(ulong *)((long)src + lVar17 + lVar38 + 0xc);
                    uVar29 = *puVar23;
                    lVar17 = lVar17 + 8;
                  } while (uVar39 == uVar29);
                  uVar29 = uVar29 ^ uVar39;
                  uVar39 = 0;
                  if (uVar29 != 0) {
                    for (; (uVar29 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                    }
                  }
                  uVar39 = (uVar39 >> 3 & 0x1fffffff) + lVar17;
                }
                else {
                  uVar29 = *puVar24 ^ *puVar32;
                  uVar39 = 0;
                  if (uVar29 != 0) {
                    for (; (uVar29 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                    }
                  }
                  uVar39 = uVar39 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_00424b0e:
                if ((puVar23 < puVar2) && ((int)*puVar32 == (int)*puVar23)) {
                  puVar23 = (ulong *)((long)puVar23 + 4);
                  puVar32 = (ulong *)((long)puVar32 + 4);
                }
                if ((puVar23 < puVar16) && ((short)*puVar32 == (short)*puVar23)) {
                  puVar23 = (ulong *)((long)puVar23 + 2);
                  puVar32 = (ulong *)((long)puVar32 + 2);
                }
                if (puVar23 < puVar3) {
                  puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar32 == (char)*puVar23));
                }
                uVar39 = (long)puVar23 - (long)puVar24;
              }
              lVar38 = *src;
              UVar13 = (int)src - iVar36;
              pUVar10[(ulong)(lVar38 * -0x30e4432340650000) >> (bVar21 & 0x3f)] = UVar13;
              pUVar9[(ulong)(lVar38 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] = UVar13;
              *(long *)seqStore->lit = *src;
              psVar33 = seqStore->sequences;
              psVar33->litLength = 0;
              psVar33->offset = 1;
              if (0xffff < uVar39 + 1) {
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar33 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar33->matchLength = (U16)(uVar39 + 1);
              seqStore->sequences = psVar33 + 1;
              src = (void *)((long)src + uVar39 + 4);
              uVar39 = uVar28;
              uVar27 = (uint)uVar26;
              local_d8 = (long *)src;
            } while (src <= plVar15);
          }
        }
        uVar37 = (uint)uVar39;
      } while (local_d8 < plVar15);
    }
  }
  else if (uVar7 == 7) {
    if (local_d8 < plVar15) {
      bVar22 = 0x40 - (char)(ms->cParams).hashLog;
      bVar21 = 0x40 - (char)(ms->cParams).chainLog;
      puVar1 = (ulong *)((long)puVar3 - 7);
      puVar2 = (ulong *)((long)puVar3 - 3);
      puVar16 = (ulong *)((long)puVar3 - 1);
      do {
        lVar38 = *local_d8;
        uVar28 = (ulong)(lVar38 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f);
        uVar26 = (ulong)(lVar38 * -0x30e44323405a9d00) >> (bVar21 & 0x3f);
        uVar29 = (long)local_d8 - (long)pBVar8;
        uVar37 = pUVar9[uVar28];
        uVar31 = (ulong)uVar37;
        uVar7 = pUVar10[uVar26];
        uVar35 = (ulong)uVar7;
        UVar13 = (U32)uVar29;
        pUVar10[uVar26] = UVar13;
        pUVar9[uVar28] = UVar13;
        plVar20 = (long *)((long)local_d8 + 1);
        if ((uVar27 == 0) ||
           (*(int *)((long)plVar20 - (ulong)uVar27) != *(int *)((long)local_d8 + 1))) {
          if ((uVar14 < uVar37) && (plVar19 = (long *)(pBVar8 + uVar31), *plVar19 == lVar38)) {
            puVar24 = (ulong *)(local_d8 + 1);
            puVar23 = (ulong *)(plVar19 + 1);
            puVar32 = puVar24;
            if (puVar24 < puVar1) {
              if (*puVar23 == *puVar24) {
                lVar38 = 0;
                do {
                  puVar23 = (ulong *)((long)local_d8 + lVar38 + 0x10);
                  if (puVar1 <= puVar23) {
                    puVar23 = (ulong *)(pBVar8 + lVar38 + uVar31 + 0x10);
                    puVar32 = (ulong *)((long)local_d8 + lVar38 + 0x10);
                    goto LAB_004242e4;
                  }
                  lVar17 = lVar38 + uVar31 + 0x10;
                  uVar39 = *puVar23;
                  lVar38 = lVar38 + 8;
                } while (*(ulong *)(pBVar8 + lVar17) == uVar39);
                uVar39 = uVar39 ^ *(ulong *)(pBVar8 + lVar17);
                uVar26 = 0;
                if (uVar39 != 0) {
                  for (; (uVar39 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                  }
                }
                uVar39 = (uVar26 >> 3 & 0x1fffffff) + lVar38;
              }
              else {
                uVar26 = *puVar24 ^ *puVar23;
                uVar39 = 0;
                if (uVar26 != 0) {
                  for (; (uVar26 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                  }
                }
                uVar39 = uVar39 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_004242e4:
              if ((puVar32 < puVar2) && ((int)*puVar23 == (int)*puVar32)) {
                puVar32 = (ulong *)((long)puVar32 + 4);
                puVar23 = (ulong *)((long)puVar23 + 4);
              }
              if ((puVar32 < puVar16) && ((short)*puVar23 == (short)*puVar32)) {
                puVar32 = (ulong *)((long)puVar32 + 2);
                puVar23 = (ulong *)((long)puVar23 + 2);
              }
              if (puVar32 < puVar3) {
                puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar23 == (char)*puVar32));
              }
              uVar39 = (long)puVar32 - (long)puVar24;
            }
            lVar38 = uVar39 + 8;
            uVar37 = (int)local_d8 - (int)plVar19;
            plVar20 = local_d8;
            if (src < local_d8) {
              pBVar34 = pBVar8 + (uVar31 - 1);
              local_d8 = (long *)((long)local_d8 + -1);
              while (plVar20 = local_d8, (BYTE)*local_d8 == *pBVar34) {
                lVar38 = lVar38 + 1;
                plVar20 = (long *)((long)local_d8 + -1);
                if ((pBVar34 <= pBVar30) ||
                   (pBVar34 = pBVar34 + -1, bVar11 = local_d8 <= src, local_d8 = plVar20, bVar11))
                break;
              }
              goto LAB_004244e5;
            }
            goto LAB_004244e8;
          }
          if ((uVar14 < uVar7) && (piVar4 = (int *)(pBVar8 + uVar35), *piVar4 == (int)*local_d8)) {
            lVar38 = *plVar20;
            uVar26 = (ulong)(lVar38 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f);
            uVar37 = pUVar9[uVar26];
            uVar39 = (ulong)uVar37;
            pUVar9[uVar26] = UVar13 + 1;
            if ((uVar14 < uVar37) && (plVar19 = (long *)(pBVar8 + uVar39), *plVar19 == lVar38)) {
              puVar24 = (ulong *)((long)local_d8 + 9);
              puVar23 = (ulong *)(plVar19 + 1);
              puVar32 = puVar24;
              if (puVar24 < puVar1) {
                if (*puVar23 == *puVar24) {
                  lVar38 = 0;
                  do {
                    puVar23 = (ulong *)((long)local_d8 + lVar38 + 0x11);
                    if (puVar1 <= puVar23) {
                      puVar23 = (ulong *)(pBVar8 + lVar38 + uVar39 + 0x10);
                      puVar32 = (ulong *)((long)local_d8 + lVar38 + 0x11);
                      goto LAB_00424458;
                    }
                    lVar17 = lVar38 + uVar39 + 0x10;
                    uVar26 = *puVar23;
                    lVar38 = lVar38 + 8;
                  } while (*(ulong *)(pBVar8 + lVar17) == uVar26);
                  uVar26 = uVar26 ^ *(ulong *)(pBVar8 + lVar17);
                  uVar28 = 0;
                  if (uVar26 != 0) {
                    for (; (uVar26 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                    }
                  }
                  uVar26 = (uVar28 >> 3 & 0x1fffffff) + lVar38;
                }
                else {
                  uVar28 = *puVar24 ^ *puVar23;
                  uVar26 = 0;
                  if (uVar28 != 0) {
                    for (; (uVar28 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                    }
                  }
                  uVar26 = uVar26 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_00424458:
                if ((puVar32 < puVar2) && ((int)*puVar23 == (int)*puVar32)) {
                  puVar32 = (ulong *)((long)puVar32 + 4);
                  puVar23 = (ulong *)((long)puVar23 + 4);
                }
                if ((puVar32 < puVar16) && ((short)*puVar23 == (short)*puVar32)) {
                  puVar32 = (ulong *)((long)puVar32 + 2);
                  puVar23 = (ulong *)((long)puVar23 + 2);
                }
                if (puVar32 < puVar3) {
                  puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar23 == (char)*puVar32));
                }
                uVar26 = (long)puVar32 - (long)puVar24;
              }
              lVar38 = uVar26 + 8;
              uVar37 = (int)plVar20 - (int)plVar19;
              if (src < plVar20) {
                pBVar34 = pBVar8 + (uVar39 - 1);
                while (plVar20 = local_d8, (BYTE)*local_d8 == *pBVar34) {
                  lVar38 = lVar38 + 1;
                  plVar20 = (long *)((long)local_d8 + -1);
                  if ((pBVar34 <= pBVar30) ||
                     (pBVar34 = pBVar34 + -1, bVar11 = local_d8 <= src, local_d8 = plVar20, bVar11))
                  break;
                }
LAB_004244e5:
                plVar20 = (long *)((long)plVar20 + 1);
              }
            }
            else {
              puVar24 = (ulong *)((long)local_d8 + 4);
              puVar23 = (ulong *)(piVar4 + 1);
              puVar32 = puVar24;
              if (puVar24 < puVar1) {
                if (*puVar23 == *puVar24) {
                  lVar38 = 0;
                  do {
                    puVar23 = (ulong *)((long)local_d8 + lVar38 + 0xc);
                    if (puVar1 <= puVar23) {
                      puVar23 = (ulong *)(pBVar8 + lVar38 + uVar35 + 0xc);
                      puVar32 = (ulong *)((long)local_d8 + lVar38 + 0xc);
                      goto LAB_00424399;
                    }
                    lVar17 = lVar38 + uVar35 + 0xc;
                    uVar39 = *puVar23;
                    lVar38 = lVar38 + 8;
                  } while (*(ulong *)(pBVar8 + lVar17) == uVar39);
                  uVar39 = uVar39 ^ *(ulong *)(pBVar8 + lVar17);
                  uVar26 = 0;
                  if (uVar39 != 0) {
                    for (; (uVar39 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                    }
                  }
                  uVar39 = (uVar26 >> 3 & 0x1fffffff) + lVar38;
                }
                else {
                  uVar26 = *puVar24 ^ *puVar23;
                  uVar39 = 0;
                  if (uVar26 != 0) {
                    for (; (uVar26 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                    }
                  }
                  uVar39 = uVar39 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_00424399:
                if ((puVar32 < puVar2) && ((int)*puVar23 == (int)*puVar32)) {
                  puVar32 = (ulong *)((long)puVar32 + 4);
                  puVar23 = (ulong *)((long)puVar23 + 4);
                }
                if ((puVar32 < puVar16) && ((short)*puVar23 == (short)*puVar32)) {
                  puVar32 = (ulong *)((long)puVar32 + 2);
                  puVar23 = (ulong *)((long)puVar23 + 2);
                }
                if (puVar32 < puVar3) {
                  puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar23 == (char)*puVar32));
                }
                uVar39 = (long)puVar32 - (long)puVar24;
              }
              lVar38 = uVar39 + 4;
              uVar37 = (int)local_d8 - (int)piVar4;
              plVar20 = local_d8;
              if (src < local_d8) {
                pBVar34 = pBVar8 + (uVar35 - 1);
                local_d8 = (long *)((long)local_d8 + -1);
                while (plVar20 = local_d8, (BYTE)*local_d8 == *pBVar34) {
                  lVar38 = lVar38 + 1;
                  plVar20 = (long *)((long)local_d8 + -1);
                  if ((pBVar34 <= pBVar30) ||
                     (pBVar34 = pBVar34 + -1, bVar11 = local_d8 <= src, local_d8 = plVar20, bVar11))
                  break;
                }
                goto LAB_004244e5;
              }
            }
LAB_004244e8:
            uVar39 = (long)plVar20 - (long)src;
            plVar18 = (long *)seqStore->lit;
            plVar19 = (long *)((long)plVar18 + uVar39);
            do {
              *plVar18 = *src;
              plVar18 = plVar18 + 1;
              src = (void *)((long)src + 8);
            } while (plVar18 < plVar19);
            seqStore->lit = seqStore->lit + uVar39;
            if (uVar39 < 0x10000) {
              psVar33 = seqStore->sequences;
            }
            else {
              seqStore->longLengthID = 1;
              psVar33 = seqStore->sequences;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar33 - (long)seqStore->sequencesStart) >> 3);
            }
            uVar26 = lVar38 - 3;
            psVar33->litLength = (U16)uVar39;
            psVar33->offset = uVar37 + 3;
            uVar39 = (ulong)uVar27;
            uVar27 = uVar37;
            goto joined_r0x00424551;
          }
          local_d8 = (long *)((long)local_d8 + ((long)local_d8 - (long)src >> 8) + 1);
        }
        else {
          lVar38 = -(ulong)uVar27;
          puVar24 = (ulong *)((long)local_d8 + 5);
          puVar32 = (ulong *)((long)local_d8 + lVar38 + 5);
          puVar23 = puVar24;
          if (puVar24 < puVar1) {
            if (*puVar32 == *puVar24) {
              lVar17 = 0;
              do {
                puVar23 = (ulong *)((long)local_d8 + lVar17 + 0xd);
                if (puVar1 <= puVar23) {
                  puVar32 = (ulong *)((long)local_d8 + lVar38 + lVar17 + 0xd);
                  puVar23 = (ulong *)((long)local_d8 + lVar17 + 0xd);
                  goto LAB_00423f6a;
                }
                uVar26 = *(ulong *)((long)local_d8 + lVar17 + lVar38 + 0xd);
                uVar28 = *puVar23;
                lVar17 = lVar17 + 8;
              } while (uVar26 == uVar28);
              uVar28 = uVar28 ^ uVar26;
              uVar26 = 0;
              if (uVar28 != 0) {
                for (; (uVar28 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                }
              }
              uVar26 = (uVar26 >> 3 & 0x1fffffff) + lVar17;
            }
            else {
              uVar28 = *puVar24 ^ *puVar32;
              uVar26 = 0;
              if (uVar28 != 0) {
                for (; (uVar28 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                }
              }
              uVar26 = uVar26 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_00423f6a:
            if ((puVar23 < puVar2) && ((int)*puVar32 == (int)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 4);
              puVar32 = (ulong *)((long)puVar32 + 4);
            }
            if ((puVar23 < puVar16) && ((short)*puVar32 == (short)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 2);
              puVar32 = (ulong *)((long)puVar32 + 2);
            }
            if (puVar23 < puVar3) {
              puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar32 == (char)*puVar23));
            }
            uVar26 = (long)puVar23 - (long)puVar24;
          }
          uVar28 = (long)plVar20 - (long)src;
          plVar18 = (long *)seqStore->lit;
          plVar19 = (long *)((long)plVar18 + uVar28);
          do {
            *plVar18 = *src;
            plVar18 = plVar18 + 1;
            src = (void *)((long)src + 8);
          } while (plVar18 < plVar19);
          seqStore->lit = seqStore->lit + uVar28;
          if (uVar28 < 0x10000) {
            psVar33 = seqStore->sequences;
          }
          else {
            seqStore->longLengthID = 1;
            psVar33 = seqStore->sequences;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar33 - (long)seqStore->sequencesStart) >> 3);
          }
          lVar38 = uVar26 + 4;
          uVar26 = uVar26 + 1;
          psVar33->litLength = (U16)uVar28;
          psVar33->offset = 1;
joined_r0x00424551:
          if (0xffff < uVar26) {
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar33 - (long)seqStore->sequencesStart) >> 3);
          }
          src = (void *)(lVar38 + (long)plVar20);
          psVar33->matchLength = (U16)uVar26;
          seqStore->sequences = psVar33 + 1;
          local_d8 = (long *)src;
          if (src <= plVar15) {
            lVar38 = *(long *)(pBVar8 + (uVar29 & 0xffffffff) + 2);
            pUVar10[(ulong)(lVar38 * -0x30e44323405a9d00) >> (bVar21 & 0x3f)] = UVar13 + 2;
            pUVar9[(ulong)(lVar38 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] = UVar13 + 2;
            UVar13 = ((int)src + -2) - iVar36;
            lVar38 = *(long *)((long)src + -2);
            pUVar10[(ulong)(lVar38 * -0x30e44323405a9d00) >> (bVar21 & 0x3f)] = UVar13;
            pUVar9[(ulong)(lVar38 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] = UVar13;
            uVar26 = (ulong)uVar27;
            do {
              uVar28 = uVar26;
              uVar26 = uVar39;
              uVar39 = uVar26;
              uVar27 = (uint)uVar28;
              local_d8 = (long *)src;
              if (((uint)uVar26 == 0) || ((int)*src != *(int *)((long)src - uVar26))) break;
              lVar38 = -uVar26;
              puVar24 = (ulong *)((long)src + 4);
              puVar32 = (ulong *)((long)src + lVar38 + 4);
              puVar23 = puVar24;
              if (puVar24 < puVar1) {
                if (*puVar32 == *puVar24) {
                  lVar17 = 0;
                  do {
                    puVar23 = (ulong *)((long)src + lVar17 + 0xc);
                    if (puVar1 <= puVar23) {
                      puVar32 = (ulong *)((long)src + lVar38 + lVar17 + 0xc);
                      puVar23 = (ulong *)((long)src + lVar17 + 0xc);
                      goto LAB_0042419b;
                    }
                    uVar39 = *(ulong *)((long)src + lVar17 + lVar38 + 0xc);
                    uVar29 = *puVar23;
                    lVar17 = lVar17 + 8;
                  } while (uVar39 == uVar29);
                  uVar29 = uVar29 ^ uVar39;
                  uVar39 = 0;
                  if (uVar29 != 0) {
                    for (; (uVar29 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                    }
                  }
                  uVar39 = (uVar39 >> 3 & 0x1fffffff) + lVar17;
                }
                else {
                  uVar29 = *puVar24 ^ *puVar32;
                  uVar39 = 0;
                  if (uVar29 != 0) {
                    for (; (uVar29 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                    }
                  }
                  uVar39 = uVar39 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_0042419b:
                if ((puVar23 < puVar2) && ((int)*puVar32 == (int)*puVar23)) {
                  puVar23 = (ulong *)((long)puVar23 + 4);
                  puVar32 = (ulong *)((long)puVar32 + 4);
                }
                if ((puVar23 < puVar16) && ((short)*puVar32 == (short)*puVar23)) {
                  puVar23 = (ulong *)((long)puVar23 + 2);
                  puVar32 = (ulong *)((long)puVar32 + 2);
                }
                if (puVar23 < puVar3) {
                  puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar32 == (char)*puVar23));
                }
                uVar39 = (long)puVar23 - (long)puVar24;
              }
              lVar38 = *src;
              UVar13 = (int)src - iVar36;
              pUVar10[(ulong)(lVar38 * -0x30e44323405a9d00) >> (bVar21 & 0x3f)] = UVar13;
              pUVar9[(ulong)(lVar38 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] = UVar13;
              *(long *)seqStore->lit = *src;
              psVar33 = seqStore->sequences;
              psVar33->litLength = 0;
              psVar33->offset = 1;
              if (0xffff < uVar39 + 1) {
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar33 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar33->matchLength = (U16)(uVar39 + 1);
              seqStore->sequences = psVar33 + 1;
              src = (void *)((long)src + uVar39 + 4);
              uVar39 = uVar28;
              uVar27 = (uint)uVar26;
              local_d8 = (long *)src;
            } while (src <= plVar15);
          }
        }
        uVar37 = (uint)uVar39;
      } while (local_d8 < plVar15);
    }
  }
  else if (local_d8 < plVar15) {
    bVar22 = 0x40 - (char)(ms->cParams).hashLog;
    bVar21 = 0x20 - (char)(ms->cParams).chainLog;
    puVar1 = (ulong *)((long)puVar3 - 7);
    puVar2 = (ulong *)((long)puVar3 - 3);
    puVar16 = (ulong *)((long)puVar3 - 1);
    do {
      uVar26 = (ulong)(*local_d8 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f);
      uVar25 = (uint)((int)*local_d8 * -0x61c8864f) >> (bVar21 & 0x1f);
      uVar28 = (long)local_d8 - (long)pBVar8;
      uVar37 = pUVar9[uVar26];
      uVar31 = (ulong)uVar37;
      uVar7 = pUVar10[uVar25];
      uVar29 = (ulong)uVar7;
      UVar13 = (U32)uVar28;
      pUVar10[uVar25] = UVar13;
      pUVar9[uVar26] = UVar13;
      plVar20 = (long *)((long)local_d8 + 1);
      if ((uVar27 == 0) || (*(int *)((long)plVar20 - (ulong)uVar27) != *(int *)((long)local_d8 + 1))
         ) {
        if ((uVar14 < uVar37) && (plVar19 = (long *)(pBVar8 + uVar31), *plVar19 == *local_d8)) {
          puVar32 = (ulong *)(local_d8 + 1);
          puVar24 = (ulong *)(plVar19 + 1);
          puVar23 = puVar32;
          if (puVar32 < puVar1) {
            if (*puVar24 == *puVar32) {
              lVar38 = 0;
              do {
                puVar24 = (ulong *)((long)local_d8 + lVar38 + 0x10);
                if (puVar1 <= puVar24) {
                  puVar24 = (ulong *)(pBVar8 + lVar38 + uVar31 + 0x10);
                  puVar23 = (ulong *)((long)local_d8 + lVar38 + 0x10);
                  goto LAB_00425f10;
                }
                lVar17 = lVar38 + uVar31 + 0x10;
                uVar39 = *puVar24;
                lVar38 = lVar38 + 8;
              } while (*(ulong *)(pBVar8 + lVar17) == uVar39);
              uVar39 = uVar39 ^ *(ulong *)(pBVar8 + lVar17);
              uVar26 = 0;
              if (uVar39 != 0) {
                for (; (uVar39 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                }
              }
              uVar39 = (uVar26 >> 3 & 0x1fffffff) + lVar38;
            }
            else {
              uVar26 = *puVar32 ^ *puVar24;
              uVar39 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                }
              }
              uVar39 = uVar39 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_00425f10:
            if ((puVar23 < puVar2) && ((int)*puVar24 == (int)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 4);
              puVar24 = (ulong *)((long)puVar24 + 4);
            }
            if ((puVar23 < puVar16) && ((short)*puVar24 == (short)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 2);
              puVar24 = (ulong *)((long)puVar24 + 2);
            }
            if (puVar23 < puVar3) {
              puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar24 == (char)*puVar23));
            }
            uVar39 = (long)puVar23 - (long)puVar32;
          }
          lVar38 = uVar39 + 8;
          uVar37 = (int)local_d8 - (int)plVar19;
          plVar20 = local_d8;
          if (src < local_d8) {
            pBVar34 = pBVar8 + (uVar31 - 1);
            local_d8 = (long *)((long)local_d8 + -1);
            while (plVar20 = local_d8, (BYTE)*local_d8 == *pBVar34) {
              lVar38 = lVar38 + 1;
              plVar20 = (long *)((long)local_d8 + -1);
              if ((pBVar34 <= pBVar30) ||
                 (pBVar34 = pBVar34 + -1, bVar11 = local_d8 <= src, local_d8 = plVar20, bVar11))
              break;
            }
            goto LAB_00426138;
          }
          goto LAB_0042613b;
        }
        if ((uVar14 < uVar7) && (piVar4 = (int *)(pBVar8 + uVar29), *piVar4 == (int)*local_d8)) {
          lVar38 = *plVar20;
          uVar26 = (ulong)(lVar38 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f);
          uVar37 = pUVar9[uVar26];
          uVar39 = (ulong)uVar37;
          pUVar9[uVar26] = UVar13 + 1;
          if ((uVar14 < uVar37) && (plVar19 = (long *)(pBVar8 + uVar39), *plVar19 == lVar38)) {
            puVar24 = (ulong *)((long)local_d8 + 9);
            puVar23 = (ulong *)(plVar19 + 1);
            puVar32 = puVar24;
            if (puVar24 < puVar1) {
              if (*puVar23 == *puVar24) {
                lVar38 = 0;
                do {
                  puVar23 = (ulong *)((long)local_d8 + lVar38 + 0x11);
                  if (puVar1 <= puVar23) {
                    puVar23 = (ulong *)(pBVar8 + lVar38 + uVar39 + 0x10);
                    puVar32 = (ulong *)((long)local_d8 + lVar38 + 0x11);
                    goto LAB_004260a0;
                  }
                  lVar17 = lVar38 + uVar39 + 0x10;
                  uVar26 = *puVar23;
                  lVar38 = lVar38 + 8;
                } while (*(ulong *)(pBVar8 + lVar17) == uVar26);
                uVar26 = uVar26 ^ *(ulong *)(pBVar8 + lVar17);
                uVar29 = 0;
                if (uVar26 != 0) {
                  for (; (uVar26 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                  }
                }
                uVar26 = (uVar29 >> 3 & 0x1fffffff) + lVar38;
              }
              else {
                uVar29 = *puVar24 ^ *puVar23;
                uVar26 = 0;
                if (uVar29 != 0) {
                  for (; (uVar29 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                  }
                }
                uVar26 = uVar26 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_004260a0:
              if ((puVar32 < puVar2) && ((int)*puVar23 == (int)*puVar32)) {
                puVar32 = (ulong *)((long)puVar32 + 4);
                puVar23 = (ulong *)((long)puVar23 + 4);
              }
              if ((puVar32 < puVar16) && ((short)*puVar23 == (short)*puVar32)) {
                puVar32 = (ulong *)((long)puVar32 + 2);
                puVar23 = (ulong *)((long)puVar23 + 2);
              }
              if (puVar32 < puVar3) {
                puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar23 == (char)*puVar32));
              }
              uVar26 = (long)puVar32 - (long)puVar24;
            }
            lVar38 = uVar26 + 8;
            uVar37 = (int)plVar20 - (int)plVar19;
            if (src < plVar20) {
              pBVar34 = pBVar8 + (uVar39 - 1);
              while (plVar20 = local_d8, (BYTE)*local_d8 == *pBVar34) {
                lVar38 = lVar38 + 1;
                plVar20 = (long *)((long)local_d8 + -1);
                if ((pBVar34 <= pBVar30) ||
                   (pBVar34 = pBVar34 + -1, bVar11 = local_d8 <= src, local_d8 = plVar20, bVar11))
                break;
              }
LAB_00426138:
              plVar20 = (long *)((long)plVar20 + 1);
            }
          }
          else {
            puVar32 = (ulong *)((long)local_d8 + 4);
            puVar24 = (ulong *)(piVar4 + 1);
            puVar23 = puVar32;
            if (puVar32 < puVar1) {
              if (*puVar24 == *puVar32) {
                lVar38 = 0;
                do {
                  puVar24 = (ulong *)((long)local_d8 + lVar38 + 0xc);
                  if (puVar1 <= puVar24) {
                    puVar24 = (ulong *)(pBVar8 + lVar38 + uVar29 + 0xc);
                    puVar23 = (ulong *)((long)local_d8 + lVar38 + 0xc);
                    goto LAB_00425fc7;
                  }
                  lVar17 = lVar38 + uVar29 + 0xc;
                  uVar39 = *puVar24;
                  lVar38 = lVar38 + 8;
                } while (*(ulong *)(pBVar8 + lVar17) == uVar39);
                uVar39 = uVar39 ^ *(ulong *)(pBVar8 + lVar17);
                uVar26 = 0;
                if (uVar39 != 0) {
                  for (; (uVar39 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                  }
                }
                uVar39 = (uVar26 >> 3 & 0x1fffffff) + lVar38;
              }
              else {
                uVar26 = *puVar32 ^ *puVar24;
                uVar39 = 0;
                if (uVar26 != 0) {
                  for (; (uVar26 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                  }
                }
                uVar39 = uVar39 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_00425fc7:
              if ((puVar23 < puVar2) && ((int)*puVar24 == (int)*puVar23)) {
                puVar23 = (ulong *)((long)puVar23 + 4);
                puVar24 = (ulong *)((long)puVar24 + 4);
              }
              if ((puVar23 < puVar16) && ((short)*puVar24 == (short)*puVar23)) {
                puVar23 = (ulong *)((long)puVar23 + 2);
                puVar24 = (ulong *)((long)puVar24 + 2);
              }
              if (puVar23 < puVar3) {
                puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar24 == (char)*puVar23));
              }
              uVar39 = (long)puVar23 - (long)puVar32;
            }
            lVar38 = uVar39 + 4;
            uVar37 = (int)local_d8 - (int)piVar4;
            plVar20 = local_d8;
            if (src < local_d8) {
              pBVar34 = pBVar8 + (uVar29 - 1);
              local_d8 = (long *)((long)local_d8 + -1);
              while (plVar20 = local_d8, (BYTE)*local_d8 == *pBVar34) {
                lVar38 = lVar38 + 1;
                plVar20 = (long *)((long)local_d8 + -1);
                if ((pBVar34 <= pBVar30) ||
                   (pBVar34 = pBVar34 + -1, bVar11 = local_d8 <= src, local_d8 = plVar20, bVar11))
                break;
              }
              goto LAB_00426138;
            }
          }
LAB_0042613b:
          uVar39 = (long)plVar20 - (long)src;
          plVar18 = (long *)seqStore->lit;
          plVar19 = (long *)((long)plVar18 + uVar39);
          do {
            *plVar18 = *src;
            plVar18 = plVar18 + 1;
            src = (void *)((long)src + 8);
          } while (plVar18 < plVar19);
          seqStore->lit = seqStore->lit + uVar39;
          if (uVar39 < 0x10000) {
            psVar33 = seqStore->sequences;
          }
          else {
            seqStore->longLengthID = 1;
            psVar33 = seqStore->sequences;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar33 - (long)seqStore->sequencesStart) >> 3);
          }
          uVar26 = lVar38 - 3;
          psVar33->litLength = (U16)uVar39;
          psVar33->offset = uVar37 + 3;
          uVar39 = (ulong)uVar27;
          uVar27 = uVar37;
          goto joined_r0x004261b9;
        }
        local_d8 = (long *)((long)local_d8 + ((long)local_d8 - (long)src >> 8) + 1);
      }
      else {
        lVar38 = -(ulong)uVar27;
        puVar24 = (ulong *)((long)local_d8 + 5);
        puVar32 = (ulong *)((long)local_d8 + lVar38 + 5);
        puVar23 = puVar24;
        if (puVar24 < puVar1) {
          if (*puVar32 == *puVar24) {
            lVar17 = 0;
            do {
              puVar23 = (ulong *)((long)local_d8 + lVar17 + 0xd);
              if (puVar1 <= puVar23) {
                puVar32 = (ulong *)((long)local_d8 + lVar38 + lVar17 + 0xd);
                puVar23 = (ulong *)((long)local_d8 + lVar17 + 0xd);
                goto LAB_00425b89;
              }
              uVar26 = *(ulong *)((long)local_d8 + lVar17 + lVar38 + 0xd);
              uVar29 = *puVar23;
              lVar17 = lVar17 + 8;
            } while (uVar26 == uVar29);
            uVar29 = uVar29 ^ uVar26;
            uVar26 = 0;
            if (uVar29 != 0) {
              for (; (uVar29 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
              }
            }
            uVar26 = (uVar26 >> 3 & 0x1fffffff) + lVar17;
          }
          else {
            uVar29 = *puVar24 ^ *puVar32;
            uVar26 = 0;
            if (uVar29 != 0) {
              for (; (uVar29 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
              }
            }
            uVar26 = uVar26 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_00425b89:
          if ((puVar23 < puVar2) && ((int)*puVar32 == (int)*puVar23)) {
            puVar23 = (ulong *)((long)puVar23 + 4);
            puVar32 = (ulong *)((long)puVar32 + 4);
          }
          if ((puVar23 < puVar16) && ((short)*puVar32 == (short)*puVar23)) {
            puVar23 = (ulong *)((long)puVar23 + 2);
            puVar32 = (ulong *)((long)puVar32 + 2);
          }
          if (puVar23 < puVar3) {
            puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar32 == (char)*puVar23));
          }
          uVar26 = (long)puVar23 - (long)puVar24;
        }
        uVar29 = (long)plVar20 - (long)src;
        plVar18 = (long *)seqStore->lit;
        plVar19 = (long *)((long)plVar18 + uVar29);
        do {
          *plVar18 = *src;
          plVar18 = plVar18 + 1;
          src = (void *)((long)src + 8);
        } while (plVar18 < plVar19);
        seqStore->lit = seqStore->lit + uVar29;
        if (uVar29 < 0x10000) {
          psVar33 = seqStore->sequences;
        }
        else {
          seqStore->longLengthID = 1;
          psVar33 = seqStore->sequences;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar33 - (long)seqStore->sequencesStart) >> 3);
        }
        lVar38 = uVar26 + 4;
        uVar26 = uVar26 + 1;
        psVar33->litLength = (U16)uVar29;
        psVar33->offset = 1;
joined_r0x004261b9:
        if (0xffff < uVar26) {
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar33 - (long)seqStore->sequencesStart) >> 3);
        }
        src = (void *)(lVar38 + (long)plVar20);
        psVar33->matchLength = (U16)uVar26;
        seqStore->sequences = psVar33 + 1;
        local_d8 = (long *)src;
        if (src <= plVar15) {
          uVar28 = uVar28 & 0xffffffff;
          pUVar10[(uint)(*(int *)(pBVar8 + uVar28 + 2) * -0x61c8864f) >> (bVar21 & 0x1f)] =
               UVar13 + 2;
          pUVar9[(ulong)(*(long *)(pBVar8 + uVar28 + 2) * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] =
               UVar13 + 2;
          UVar13 = ((int)src + -2) - iVar36;
          pUVar10[(uint)(*(int *)((long)src + -2) * -0x61c8864f) >> (bVar21 & 0x1f)] = UVar13;
          pUVar9[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] =
               UVar13;
          uVar26 = (ulong)uVar27;
          do {
            uVar28 = uVar26;
            uVar26 = uVar39;
            uVar39 = uVar26;
            uVar27 = (uint)uVar28;
            local_d8 = (long *)src;
            if (((uint)uVar26 == 0) || ((int)*src != *(int *)((long)src - uVar26))) break;
            lVar38 = -uVar26;
            puVar24 = (ulong *)((long)src + 4);
            puVar32 = (ulong *)((long)src + lVar38 + 4);
            puVar23 = puVar24;
            if (puVar24 < puVar1) {
              if (*puVar32 == *puVar24) {
                lVar17 = 0;
                do {
                  puVar23 = (ulong *)((long)src + lVar17 + 0xc);
                  if (puVar1 <= puVar23) {
                    puVar32 = (ulong *)((long)src + lVar38 + lVar17 + 0xc);
                    puVar23 = (ulong *)((long)src + lVar17 + 0xc);
                    goto LAB_00425dc4;
                  }
                  uVar39 = *(ulong *)((long)src + lVar17 + lVar38 + 0xc);
                  uVar29 = *puVar23;
                  lVar17 = lVar17 + 8;
                } while (uVar39 == uVar29);
                uVar29 = uVar29 ^ uVar39;
                uVar39 = 0;
                if (uVar29 != 0) {
                  for (; (uVar29 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                  }
                }
                uVar39 = (uVar39 >> 3 & 0x1fffffff) + lVar17;
              }
              else {
                uVar29 = *puVar24 ^ *puVar32;
                uVar39 = 0;
                if (uVar29 != 0) {
                  for (; (uVar29 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                  }
                }
                uVar39 = uVar39 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_00425dc4:
              if ((puVar23 < puVar2) && ((int)*puVar32 == (int)*puVar23)) {
                puVar23 = (ulong *)((long)puVar23 + 4);
                puVar32 = (ulong *)((long)puVar32 + 4);
              }
              if ((puVar23 < puVar16) && ((short)*puVar32 == (short)*puVar23)) {
                puVar23 = (ulong *)((long)puVar23 + 2);
                puVar32 = (ulong *)((long)puVar32 + 2);
              }
              if (puVar23 < puVar3) {
                puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar32 == (char)*puVar23));
              }
              uVar39 = (long)puVar23 - (long)puVar24;
            }
            UVar13 = (int)src - iVar36;
            pUVar10[(uint)((int)*src * -0x61c8864f) >> (bVar21 & 0x1f)] = UVar13;
            pUVar9[(ulong)(*src * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] = UVar13;
            *(long *)seqStore->lit = *src;
            psVar33 = seqStore->sequences;
            psVar33->litLength = 0;
            psVar33->offset = 1;
            if (0xffff < uVar39 + 1) {
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar33 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar33->matchLength = (U16)(uVar39 + 1);
            seqStore->sequences = psVar33 + 1;
            src = (void *)((long)src + uVar39 + 4);
            uVar39 = uVar28;
            uVar27 = (uint)uVar26;
            local_d8 = (long *)src;
          } while (src <= plVar15);
        }
      }
      uVar37 = (uint)uVar39;
    } while (local_d8 < plVar15);
  }
  uVar14 = 0;
  if (uVar12 < uVar6) {
    uVar14 = uVar6;
  }
  if (uVar12 < uVar5) {
    uVar14 = uVar5;
  }
  if (uVar27 == 0) {
    uVar27 = uVar14;
  }
  if (uVar37 != 0) {
    uVar14 = uVar37;
  }
  *rep = uVar27;
  rep[1] = uVar14;
  return (long)puVar3 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 4, ZSTD_noDict);
    case 5 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 5, ZSTD_noDict);
    case 6 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 6, ZSTD_noDict);
    case 7 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 7, ZSTD_noDict);
    }
}